

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O3

void __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::BeginPLTerm
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,int num_breakpoints)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"piecewise-linear term","");
  TestProblemBuilder::ReportUnhandledConstruct((TestProblemBuilder *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

PLTermBuilder BeginPLTerm(int num_breakpoints) {
    internal::Unused(num_breakpoints);
    MP_DISPATCH(ReportUnhandledConstruct("piecewise-linear term"));
    return PLTermBuilder();
  }